

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minmax_n_helpers.hpp
# Opt level: O0

void __thiscall
duckdb::BinaryAggregateHeap<long,_duckdb::string_t,_duckdb::LessThan>::Insert
          (BinaryAggregateHeap<long,_duckdb::string_t,_duckdb::LessThan> *this,
          ArenaAllocator *allocator,long *key,string_t *value)

{
  bool bVar1;
  _func_bool_pair<duckdb::HeapEntry<long>,_duckdb::HeapEntry<duckdb::string_t>_>_ptr_pair<duckdb::HeapEntry<long>,_duckdb::HeapEntry<duckdb::string_t>_>_ptr
  *in_RCX;
  pair<duckdb::HeapEntry<long>,_duckdb::HeapEntry<duckdb::string_t>_> *in_RDX;
  pair<duckdb::HeapEntry<long>,_duckdb::HeapEntry<duckdb::string_t>_> *in_RSI;
  ulong *in_RDI;
  _func_bool_pair<duckdb::HeapEntry<long>,_duckdb::HeapEntry<duckdb::string_t>_>_ptr_pair<duckdb::HeapEntry<long>,_duckdb::HeapEntry<duckdb::string_t>_>_ptr
  *in_stack_00000040;
  pair<duckdb::HeapEntry<long>,_duckdb::HeapEntry<duckdb::string_t>_> *in_stack_00000048;
  pair<duckdb::HeapEntry<long>,_duckdb::HeapEntry<duckdb::string_t>_> *in_stack_00000050;
  string_t *in_stack_00000080;
  ArenaAllocator *in_stack_00000088;
  HeapEntry<duckdb::string_t> *in_stack_00000090;
  
  if (in_RDI[2] < *in_RDI) {
    HeapEntry<long>::Assign
              ((HeapEntry<long> *)(in_RDI[1] + in_RDI[2] * 0x28),(ArenaAllocator *)in_RSI,
               (long *)in_RDX);
    HeapEntry<duckdb::string_t>::Assign(in_stack_00000090,in_stack_00000088,in_stack_00000080);
    in_RDI[2] = in_RDI[2] + 1;
    std::
    push_heap<std::pair<duckdb::HeapEntry<long>,duckdb::HeapEntry<duckdb::string_t>>*,bool(*)(std::pair<duckdb::HeapEntry<long>,duckdb::HeapEntry<duckdb::string_t>>const&,std::pair<duckdb::HeapEntry<long>,duckdb::HeapEntry<duckdb::string_t>>const&)>
              (in_stack_00000050,in_stack_00000048,in_stack_00000040);
  }
  else {
    bVar1 = LessThan::Operation<long>((long *)in_RCX,(long *)in_RDI);
    if (bVar1) {
      std::
      pop_heap<std::pair<duckdb::HeapEntry<long>,duckdb::HeapEntry<duckdb::string_t>>*,bool(*)(std::pair<duckdb::HeapEntry<long>,duckdb::HeapEntry<duckdb::string_t>>const&,std::pair<duckdb::HeapEntry<long>,duckdb::HeapEntry<duckdb::string_t>>const&)>
                (in_RSI,in_RDX,in_RCX);
      HeapEntry<long>::Assign
                ((HeapEntry<long> *)(in_RDI[1] + (in_RDI[2] - 1) * 0x28),(ArenaAllocator *)in_RSI,
                 (long *)in_RDX);
      HeapEntry<duckdb::string_t>::Assign(in_stack_00000090,in_stack_00000088,in_stack_00000080);
      std::
      push_heap<std::pair<duckdb::HeapEntry<long>,duckdb::HeapEntry<duckdb::string_t>>*,bool(*)(std::pair<duckdb::HeapEntry<long>,duckdb::HeapEntry<duckdb::string_t>>const&,std::pair<duckdb::HeapEntry<long>,duckdb::HeapEntry<duckdb::string_t>>const&)>
                (in_stack_00000050,in_stack_00000048,in_stack_00000040);
    }
  }
  return;
}

Assistant:

void Insert(ArenaAllocator &allocator, const K &key, const V &value) {
		D_ASSERT(capacity != 0); // must be initialized

		// If the heap is not full, insert the value into a new slot
		if (size < capacity) {
			heap[size].first.Assign(allocator, key);
			heap[size].second.Assign(allocator, value);
			size++;
			std::push_heap(heap, heap + size, Compare);
		}
		// If the heap is full, check if the value is greater than the smallest value in the heap
		// If it is, assign the new value to the slot and re-heapify
		else if (K_COMPARATOR::Operation(key, heap[0].first.value)) {
			std::pop_heap(heap, heap + size, Compare);
			heap[size - 1].first.Assign(allocator, key);
			heap[size - 1].second.Assign(allocator, value);
			std::push_heap(heap, heap + size, Compare);
		}
		D_ASSERT(std::is_heap(heap, heap + size, Compare));
	}